

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_storage.cpp
# Opt level: O2

uint ChannelsFromFmt(FmtChannels chans,uint ambiorder)

{
  uint uVar1;
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,chans)) {
  case 0:
    uVar1 = 1;
    break;
  case 1:
  case 2:
    uVar1 = 2;
    break;
  case 3:
    uVar1 = 4;
    break;
  case 4:
    uVar1 = 6;
    break;
  case 5:
    uVar1 = 7;
    break;
  case 6:
    uVar1 = 8;
    break;
  case 7:
    return ambiorder * 2 + 1;
  case 8:
    return (ambiorder + 1) * (ambiorder + 1);
  default:
    return 0;
  }
  return uVar1;
}

Assistant:

uint ChannelsFromFmt(FmtChannels chans, uint ambiorder) noexcept
{
    switch(chans)
    {
    case FmtMono: return 1;
    case FmtStereo: return 2;
    case FmtRear: return 2;
    case FmtQuad: return 4;
    case FmtX51: return 6;
    case FmtX61: return 7;
    case FmtX71: return 8;
    case FmtBFormat2D: return (ambiorder*2) + 1;
    case FmtBFormat3D: return (ambiorder+1) * (ambiorder+1);
    }
    return 0;
}